

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * TEST_parse_same_option_twice_string_with_unique(void)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  cargo_t cargo;
  char *s;
  int i;
  char *args [7];
  
  iVar1 = cargo_init(&cargo,0,"program");
  if (iVar1 == 0) {
    s = (char *)0x0;
    args[6] = "def";
    args[4] = "4";
    args[5] = "--alpha";
    args[2] = "abc";
    args[3] = "--beta";
    args[0]._0_4_ = 0x127be1;
    args[0]._4_4_ = 0;
    args[1]._0_4_ = 0x124e63;
    args[1]._4_4_ = 0;
    iVar1 = cargo_add_option(cargo,CARGO_OPT_UNIQUE,"--alpha -a","The alpha","s");
    iVar2 = cargo_add_option(cargo,0,"--beta -b","The beta","i",&i);
    if (iVar2 == 0 && iVar1 == 0) {
      iVar1 = cargo_parse(cargo,0,1,7,args);
      printf("--alpha = %s\n",s);
      if (iVar1 == 0) {
        pcVar3 = "Succesfully parsed duplicate option";
      }
      else {
        pcVar3 = "Expected --alpha to have value NULL";
        if (s == (char *)0x0) {
          pcVar3 = (char *)0x0;
        }
      }
    }
    else {
      pcVar3 = "Failed to add options";
    }
    _cargo_xfree(&s);
    cargo_destroy(&cargo);
  }
  else {
    pcVar3 = "Failed to init cargo";
  }
  return pcVar3;
}

Assistant:

_TEST_START(TEST_parse_same_option_twice_string_with_unique)
{
    char *s = NULL;
    int i;
    char *args[] = { "program", "--alpha", "abc", "--beta", "4", "--alpha", "def" };

    ret |= cargo_add_option(cargo, CARGO_OPT_UNIQUE,
                            "--alpha -a", "The alpha", "s", &s);
    ret |= cargo_add_option(cargo, 0, "--beta -b", "The beta", "i", &i);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    printf("--alpha = %s\n", s);
    cargo_assert(ret != 0, "Succesfully parsed duplicate option");
    cargo_assert(s == NULL, "Expected --alpha to have value NULL");

    _TEST_CLEANUP();
    _cargo_xfree(&s);
}